

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O3

vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *
cnn::AllocateShadowParameters
          (vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>
           *__return_storage_ptr__,Model *m)

{
  undefined8 *puVar1;
  Parameters **p;
  undefined8 *puVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::reserve
            (__return_storage_ptr__,*(long *)(m + 0x20) - *(long *)(m + 0x18) >> 3);
  puVar1 = *(undefined8 **)(m + 0x20);
  for (puVar2 = *(undefined8 **)(m + 0x18); puVar2 != puVar1; puVar2 = puVar2 + 1) {
    std::vector<cnn::ShadowParameters,std::allocator<cnn::ShadowParameters>>::
    emplace_back<cnn::Parameters&>
              ((vector<cnn::ShadowParameters,std::allocator<cnn::ShadowParameters>> *)
               __return_storage_ptr__,(Parameters *)*puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ShadowParameters> AllocateShadowParameters(const Model& m) {
  vector<ShadowParameters> v;
  v.reserve(m.parameters_list().size());
  for (auto& p : m.parameters_list())
    v.emplace_back(*p);
  return v;
}